

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.h
# Opt level: O2

ON_3dPoint * __thiscall
ON_3dPointListRef::operator[]
          (ON_3dPoint *__return_storage_ptr__,ON_3dPointListRef *this,int point_index)

{
  undefined8 uVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  ulong uVar6;
  double dVar7;
  
  dVar4 = -1.23432101234321e+308;
  dVar5 = -1.23432101234321e+308;
  dVar7 = -1.23432101234321e+308;
  if ((-1 < point_index) && ((uint)point_index < this->m_point_count)) {
    pdVar2 = this->m_dP;
    if (pdVar2 == (double *)0x0) {
      uVar6 = (ulong)(point_index * this->m_point_stride);
      uVar1 = *(undefined8 *)(this->m_fP + uVar6);
      dVar4 = (double)(float)uVar1;
      dVar5 = (double)(float)((ulong)uVar1 >> 0x20);
      dVar7 = (double)this->m_fP[uVar6 + 2];
    }
    else {
      uVar6 = (ulong)(point_index * this->m_point_stride);
      dVar4 = pdVar2[uVar6];
      dVar5 = (pdVar2 + uVar6)[1];
      dVar7 = pdVar2[uVar6 + 2];
    }
  }
  auVar3._8_4_ = SUB84(dVar5,0);
  auVar3._0_8_ = dVar4;
  auVar3._12_4_ = (int)((ulong)dVar5 >> 0x20);
  __return_storage_ptr__->x = dVar4;
  __return_storage_ptr__->y = (double)auVar3._8_8_;
  __return_storage_ptr__->z = dVar7;
  return __return_storage_ptr__;
}

Assistant:

inline ON_3dPoint operator[](int point_index) const
  {
    double buffer[3];
    if ( point_index >= 0 && ((unsigned int)point_index) < m_point_count )
    {
      if ( m_dP )
      {
        const double* p = m_dP + (point_index*m_point_stride);
        buffer[0]  = *p++;
        buffer[1]  = *p++;
        buffer[2]  = *p;
      }
      else
      {
        const float* p = m_fP + (point_index*m_point_stride);
        buffer[0]  = *p++;
        buffer[1]  = *p++;
        buffer[2]  = *p;
      }
    }
    else
    {
      buffer[0] = buffer[1] = buffer[2] = ON_UNSET_VALUE;
    }
    return *((const ON_3dPoint*)buffer);  
  }